

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O3

void riffts1(float *ioptr,long M,long Rows,float *Utbl,short *BRLow)

{
  long lVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  sbyte sVar13;
  long StageCnt;
  byte bVar14;
  long lVar15;
  float *pfVar16;
  byte bVar17;
  uint uVar18;
  ulong uVar19;
  double dVar20;
  long lVar21;
  float *pfVar22;
  float *p0r;
  float *pfVar23;
  ulong uVar24;
  ulong uVar25;
  float *pfVar26;
  long lVar27;
  ulong uVar28;
  ushort uVar29;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  ulong uVar30;
  undefined1 auVar58 [64];
  
  auVar75 = _DAT_001095e0;
  auVar32 = _DAT_001095c0;
  auVar47 = _DAT_001095b0;
  dVar20 = (double)(0x3ff0000000000000 - (M << 0x34));
  auVar31._0_4_ = (float)dVar20;
  auVar31._4_4_ = (int)((ulong)dVar20 >> 0x20);
  auVar31._8_8_ = 0;
  switch(M) {
  case 0:
    break;
  case 1:
    if (0 < Rows) {
      pfVar23 = ioptr + 1;
      uVar25 = Rows + 1;
      do {
        fVar2 = pfVar23[-1];
        uVar25 = uVar25 - 1;
        pfVar23[-1] = (*pfVar23 + fVar2) * auVar31._0_4_;
        *pfVar23 = (fVar2 - *pfVar23) * auVar31._0_4_;
        pfVar23 = pfVar23 + (1L << (M & 0x3fU));
      } while (1 < uVar25);
    }
    break;
  case 2:
    if (0 < Rows) {
      uVar25 = Rows + 1;
      do {
        uVar25 = uVar25 - 1;
        fVar2 = (float)*(undefined8 *)(ioptr + 2);
        fVar5 = (float)((ulong)*(undefined8 *)(ioptr + 2) >> 0x20);
        auVar34._0_4_ = fVar2 + fVar2;
        auVar34._4_4_ = fVar5 + fVar5;
        auVar34._8_8_ = 0;
        auVar35 = vpermt2ps_avx512vl(auVar34,auVar47,ZEXT416((uint)(ioptr[1] + *ioptr)));
        auVar33 = vinsertps_avx(auVar35,ZEXT416((uint)(*ioptr - ioptr[1])),0x30);
        auVar34 = vshufpd_avx(auVar33,auVar33,1);
        auVar36._0_4_ = auVar35._0_4_ + auVar34._0_4_;
        auVar36._4_4_ = auVar35._4_4_ + auVar34._4_4_;
        auVar36._8_4_ = auVar35._8_4_ + auVar34._8_4_;
        auVar36._12_4_ = auVar35._12_4_ + auVar34._12_4_;
        auVar33 = vsubps_avx(auVar33,auVar34);
        auVar33 = vpermt2ps_avx512vl(auVar36,auVar32,auVar33);
        *ioptr = auVar33._0_4_ * auVar31._0_4_;
        ioptr[1] = auVar33._4_4_ * auVar31._0_4_;
        ioptr[2] = auVar33._8_4_ * auVar31._0_4_;
        ioptr[3] = auVar33._12_4_ * auVar31._0_4_;
        ioptr = ioptr + (1L << (M & 0x3fU));
      } while (1 < uVar25);
    }
    break;
  case 3:
    if (0 < Rows) {
      uVar25 = Rows + 1;
      do {
        uVar25 = uVar25 - 1;
        fVar2 = ioptr[1] + *ioptr;
        fVar10 = *ioptr - ioptr[1];
        fVar5 = ioptr[6] + ioptr[2];
        fVar11 = ioptr[3] - ioptr[7];
        fVar6 = ioptr[5] + ioptr[5];
        fVar9 = ioptr[4] + ioptr[4];
        fVar7 = (ioptr[2] - ioptr[6]) * 0.70710677;
        fVar8 = (ioptr[7] + ioptr[3]) * -0.70710677;
        fVar12 = (fVar5 - fVar7) + fVar8;
        fVar8 = fVar11 + fVar7 + fVar8;
        auVar47 = vinsertps_avx(ZEXT416((uint)(fVar9 + fVar2)),ZEXT416((uint)(fVar10 - fVar6)),0x10)
        ;
        fVar12 = (fVar12 - (fVar5 + fVar5)) + fVar12;
        auVar32 = vinsertps_avx(ZEXT416((uint)(fVar5 + fVar5)),
                                ZEXT416((uint)((fVar8 - (fVar11 + fVar11)) + fVar8)),0x10);
        auVar47 = vinsertps_avx(auVar47,ZEXT416((uint)(fVar11 + fVar11)),0x20);
        auVar32 = vinsertps_avx(auVar32,ZEXT416((uint)(fVar2 - fVar9)),0x20);
        auVar47 = vinsertps_avx(auVar47,ZEXT416((uint)(fVar6 + fVar10)),0x30);
        auVar71._16_16_ = auVar32;
        auVar71._0_16_ = auVar47;
        auVar72._4_4_ = fVar12;
        auVar72._0_4_ = fVar12;
        auVar72._8_4_ = fVar12;
        auVar72._12_4_ = fVar12;
        auVar72._16_4_ = fVar12;
        auVar72._20_4_ = fVar12;
        auVar72._24_4_ = fVar12;
        auVar72._28_4_ = fVar12;
        auVar72 = vblendps_avx(auVar71,auVar72,0x80);
        auVar48 = vpermpd_avx2(auVar72,0x4e);
        auVar73._0_4_ = auVar72._0_4_ + auVar48._0_4_;
        auVar73._4_4_ = auVar72._4_4_ + auVar48._4_4_;
        auVar73._8_4_ = auVar72._8_4_ + auVar48._8_4_;
        auVar73._12_4_ = auVar72._12_4_ + auVar48._12_4_;
        auVar73._16_4_ = auVar72._16_4_ + auVar48._16_4_;
        auVar73._20_4_ = auVar72._20_4_ + auVar48._20_4_;
        auVar73._24_4_ = auVar72._24_4_ + auVar48._24_4_;
        auVar73._28_4_ = auVar72._28_4_ + auVar48._28_4_;
        auVar72 = vsubps_avx(auVar71,auVar48);
        auVar48 = vpermt2ps_avx512vl(auVar73,auVar75,auVar72);
        *ioptr = auVar48._0_4_ * auVar31._0_4_;
        ioptr[1] = auVar48._4_4_ * auVar31._0_4_;
        ioptr[2] = auVar48._8_4_ * auVar31._0_4_;
        ioptr[3] = auVar48._12_4_ * auVar31._0_4_;
        ioptr[4] = auVar48._16_4_ * auVar31._0_4_;
        ioptr[5] = auVar48._20_4_ * auVar31._0_4_;
        ioptr[6] = auVar48._24_4_ * auVar31._0_4_;
        ioptr[7] = auVar72._28_4_;
        ioptr = ioptr + (1L << (M & 0x3fU));
      } while (1 < uVar25);
    }
    break;
  case 4:
    if (0 < Rows) {
      auVar49 = vbroadcastss_avx512f(auVar31);
      uVar25 = Rows + 1;
      do {
        uVar25 = uVar25 - 1;
        auVar31 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 4)),
                                 ZEXT416((uint)*(float *)*(undefined1 (*) [64])ioptr));
        auVar47 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x30))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x10)
                                         ));
        auVar32 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x10))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x30)
                                         ));
        auVar33 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x14))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x34)
                                         ));
        auVar34 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x34))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x14)
                                         ));
        auVar35 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0xc)),
                                 ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x3c))
                                );
        auVar36 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x3c))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0xc))
                                );
        auVar37 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x1c))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x2c)
                                         ));
        auVar38 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x2c))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x1c)
                                         ));
        auVar39 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x24))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x24)
                                         ));
        auVar40 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x20))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x20)
                                         ));
        fVar5 = auVar34._0_4_ * -0.70710677;
        auVar41 = ZEXT416((uint)(*(float *)*(undefined1 (*) [64])ioptr -
                                *(float *)((long)*(undefined1 (*) [64])ioptr + 4)));
        auVar34 = vsubss_avx512f(auVar41,auVar39);
        auVar39 = vaddss_avx512f(auVar39,auVar41);
        auVar41 = ZEXT416((uint)(auVar32._0_4_ * 0.70710677));
        auVar32 = vsubss_avx512f(auVar47,auVar41);
        auVar41 = vaddss_avx512f(auVar33,auVar41);
        fVar2 = auVar47._0_4_ + auVar47._0_4_;
        auVar47 = vaddss_avx512f(auVar32,ZEXT416((uint)fVar5));
        auVar33 = vaddss_avx512f(auVar33,auVar33);
        auVar32 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x38))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 8)));
        auVar42 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 8)),
                                 ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x38))
                                );
        auVar69 = SUB6416(ZEXT464(0xbec3ef15),0);
        auVar43 = vfmadd213ss_avx512f(auVar69,auVar42,auVar32);
        auVar42 = vfmadd132ss_avx512f(auVar42,auVar35,SUB6416(ZEXT464(0x3f6c835e),0));
        auVar45 = ZEXT416((uint)(auVar41._0_4_ + fVar5));
        auVar41 = vsubss_avx512f(auVar45,auVar33);
        auVar44 = vsubss_avx512f(auVar47,ZEXT416((uint)fVar2));
        auVar41 = vaddss_avx512f(auVar41,auVar45);
        auVar44 = vaddss_avx512f(auVar44,auVar47);
        auVar70 = SUB6416(ZEXT464(0xbf6c835e),0);
        auVar43 = vfmadd231ss_avx512f(auVar43,auVar36,auVar70);
        auVar47 = vfmadd231ss_fma(auVar42,auVar69,auVar36);
        auVar36 = vaddss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x28))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x18)
                                         ));
        auVar42 = vsubss_avx512f(ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x18))
                                 ,ZEXT416((uint)*(float *)((long)*(undefined1 (*) [64])ioptr + 0x28)
                                         ));
        auVar45 = vaddss_avx512f(auVar41,auVar34);
        auVar34 = vsubss_avx512f(auVar34,auVar41);
        auVar41 = vsubss_avx512f(auVar39,auVar44);
        auVar39 = vaddss_avx512f(auVar44,auVar39);
        auVar44 = vfmadd213ss_avx512f(auVar70,auVar42,auVar36);
        auVar42 = vfmadd132ss_avx512f(auVar42,auVar37,SUB6416(ZEXT464(0x3ec3ef15),0));
        auVar74 = SUB6416(ZEXT464(0x40000000),0);
        auVar35 = vfnmadd213ss_avx512f(auVar35,auVar74,auVar47);
        auVar46 = vfmsub213ss_avx512f(auVar32,auVar74,auVar43);
        auVar44 = vfmadd231ss_avx512f(auVar44,auVar38,auVar69);
        auVar32 = vfmadd231ss_fma(auVar42,auVar70,auVar38);
        auVar38 = vaddss_avx512f(auVar40,auVar31);
        auVar31 = vsubss_avx512f(auVar31,auVar40);
        auVar40 = vaddss_avx512f(ZEXT416((uint)fVar2),auVar38);
        fVar2 = auVar38._0_4_ - fVar2;
        auVar38 = vaddss_avx512f(auVar33,auVar31);
        auVar42 = vsubss_avx512f(auVar31,auVar33);
        auVar31 = vfmsub213ss_avx512f(auVar36,auVar74,auVar44);
        auVar33 = vfnmadd213ss_avx512f(auVar37,auVar74,auVar32);
        auVar36 = vaddss_avx512f(auVar43,auVar31);
        auVar37 = vaddss_avx512f(auVar47,auVar33);
        auVar31 = vsubss_avx512f(auVar43,auVar31);
        auVar47 = vsubss_avx512f(auVar47,auVar33);
        auVar33 = vsubss_avx512f(auVar32,auVar35);
        auVar32 = vaddss_avx512f(auVar35,auVar32);
        auVar35 = vsubss_avx512f(auVar44,auVar46);
        auVar43 = vaddss_avx512f(auVar46,auVar44);
        auVar44 = vaddss_avx512f(auVar32,auVar37);
        auVar37 = vsubss_avx512f(auVar37,auVar32);
        auVar32 = vaddss_avx512f(auVar33,auVar31);
        auVar31 = vsubss_avx512f(auVar31,auVar33);
        auVar33 = vaddss_avx512f(auVar43,auVar36);
        auVar36 = vsubss_avx512f(auVar36,auVar43);
        auVar43 = vsubss_avx512f(auVar47,auVar35);
        auVar47 = vaddss_avx512f(auVar35,auVar47);
        fVar5 = auVar31._0_4_ * 0.70710677;
        fVar6 = auVar47._0_4_ * 0.70710677;
        auVar47 = vsubss_avx512f(auVar40,auVar33);
        auVar35 = vsubss_avx512f(auVar45,auVar44);
        auVar31 = vaddss_avx512f(auVar33,auVar40);
        auVar33 = vaddss_avx512f(auVar44,auVar45);
        auVar32 = vmulss_avx512f(auVar32,SUB6416(ZEXT464(0x3f3504f3),0));
        auVar40 = vsubss_avx512f(auVar34,auVar36);
        auVar34 = vaddss_avx512f(auVar36,auVar34);
        auVar36 = vmulss_avx512f(auVar43,SUB6416(ZEXT464(0x3f3504f3),0));
        auVar43 = vsubss_avx512f(auVar42,ZEXT416((uint)fVar5));
        auVar31 = vinsertps_avx512f(auVar31,auVar33,0x10);
        auVar33 = vaddss_avx512f(auVar37,ZEXT416((uint)fVar2));
        auVar44 = vaddss_avx512f(auVar32,auVar38);
        auVar45 = vsubss_avx512f(auVar41,auVar32);
        auVar32 = vinsertps_avx512f(auVar47,auVar35,0x10);
        auVar43 = vaddss_avx512f(auVar43,ZEXT416((uint)fVar6));
        auVar47 = vinsertps_avx(ZEXT416((uint)(fVar2 - auVar37._0_4_)),auVar34,0x10);
        auVar33 = vinsertps_avx512f(auVar33,auVar40,0x10);
        auVar34 = vfmsub213ss_fma(auVar42,auVar74,auVar43);
        auVar37 = ZEXT416((uint)(auVar39._0_4_ - (fVar5 + fVar6)));
        auVar35 = vfmsub213ss_fma(auVar39,auVar74,auVar37);
        auVar32 = vinsertps_avx512f(auVar32,auVar43,0x20);
        auVar32 = vinsertps_avx(auVar32,auVar37,0x30);
        auVar31 = vinsertps_avx512f(auVar31,auVar34,0x20);
        auVar37 = vaddss_avx512f(auVar45,auVar36);
        auVar31 = vinsertps_avx(auVar31,auVar35,0x30);
        auVar35 = vaddss_avx512f(auVar44,auVar36);
        auVar36 = vfmsub213ss_avx512f(auVar41,auVar74,auVar37);
        auVar34 = vfmsub213ss_fma(auVar38,auVar74,auVar35);
        auVar33 = vinsertps_avx512f(auVar33,auVar35,0x20);
        auVar33 = vinsertps_avx(auVar33,auVar37,0x30);
        auVar75._16_16_ = auVar33;
        auVar75._0_16_ = auVar32;
        auVar47 = vinsertps_avx(auVar47,auVar34,0x20);
        auVar47 = vinsertps_avx512f(auVar47,auVar36,0x30);
        auVar50 = vinsertf64x4_avx512f(ZEXT3264(CONCAT1616(auVar47,auVar31)),auVar75,1);
        auVar50 = vmulps_avx512f(auVar50,auVar49);
        *(undefined1 (*) [64])ioptr = auVar50;
        ioptr = (float *)((long)*(undefined1 (*) [64])ioptr + (1L << (M & 0x3fU)) * 4);
      } while (1 < uVar25);
    }
    break;
  default:
    if (0 < Rows) {
      uVar25 = M - 1;
      uVar24 = 1L << (uVar25 & 0x3f);
      uVar18 = (int)M - 3;
      lVar27 = 1L << ((ulong)uVar18 & 0x3f);
      bVar17 = (byte)uVar18;
      sVar13 = (bVar17 < 0x41) * ('@' - bVar17);
      uVar19 = -1L << (M - 2U & 0x3f);
      StageCnt = (long)(M - 2U) / 3;
      lVar21 = 2L << (uVar25 & 0x3f);
      lVar1 = M + -2 + StageCnt * -3;
      auVar49 = vpbroadcastq_avx512f();
      pfVar23 = ioptr + uVar24;
      auVar49 = vmovdqu64_avx512f(auVar49);
      pfVar26 = ioptr + uVar19 * -2 + -1;
      do {
        fVar2 = *ioptr;
        pfVar16 = ioptr + (uVar24 >> 1);
        fVar5 = pfVar16[uVar24] + *pfVar16;
        auVar47._8_4_ = 0x80000000;
        auVar47._0_8_ = 0x8000000080000000;
        auVar47._12_4_ = 0x80000000;
        auVar47 = vxorps_avx512vl(ZEXT416((uint)Utbl[lVar27]),auVar47);
        fVar12 = pfVar16[1] - pfVar16[uVar24 + 1];
        fVar8 = Utbl[lVar27] * (*pfVar16 - pfVar16[uVar24]);
        fVar9 = (pfVar16[uVar24 + 1] + pfVar16[1]) * auVar47._0_4_;
        fVar6 = (fVar5 - fVar8) + fVar9;
        fVar9 = fVar12 + fVar8 + fVar9;
        uVar3 = *(undefined8 *)(ioptr + uVar24);
        auVar47 = vfmadd132ss_fma(ZEXT416((uint)fVar12),ZEXT416((uint)fVar9),ZEXT416(0xc0000000));
        *ioptr = ioptr[1] + fVar2;
        ioptr[1] = fVar2 - ioptr[1];
        auVar33._0_4_ = (float)uVar3 * 2.0;
        auVar33._4_4_ = (float)((ulong)uVar3 >> 0x20) * -2.0;
        auVar33._8_8_ = 0;
        auVar34 = SUB6416(ZEXT464(0x40000000),0);
        auVar32 = vfmsub132ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar6),auVar34);
        uVar3 = vmovlps_avx(auVar33);
        *(undefined8 *)(ioptr + uVar24) = uVar3;
        *pfVar16 = fVar6;
        pfVar16[1] = fVar9;
        pfVar16[uVar24] = auVar32._0_4_;
        pfVar16[uVar24 + 1] = auVar47._0_4_;
        if ((ulong)(-1L << sVar13) >> sVar13 != 0) {
          fVar2 = Utbl[1];
          fVar5 = Utbl[~uVar19];
          lVar15 = 1;
          pfVar16 = pfVar26;
          pfVar22 = Utbl + (-2 - uVar19);
          do {
            fVar6 = pfVar16[uVar24] + ioptr[lVar15 * 2 + 1];
            fVar9 = pfVar16[uVar24 - 1] + ioptr[lVar15 * 2];
            fVar8 = pfVar23[lVar15 * 2 + 1] + *pfVar16;
            auVar33 = ZEXT416((uint)fVar5);
            auVar47 = ZEXT416((uint)(ioptr[lVar15 * 2] - pfVar16[uVar24 - 1]));
            auVar32 = vfnmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar6)),auVar47,auVar33);
            auVar38 = ZEXT416((uint)(ioptr[lVar15 * 2 + 1] - pfVar16[uVar24]));
            auVar39 = ZEXT416((uint)fVar2);
            auVar47 = vfmadd213ss_fma(auVar47,auVar39,auVar38);
            auVar35 = vfnmadd231ss_fma(auVar47,auVar33,ZEXT416((uint)fVar6));
            fVar2 = fVar9 + auVar32._0_4_;
            fVar6 = pfVar23[lVar15 * 2] + pfVar16[-1];
            auVar37 = ZEXT416((uint)(*pfVar16 - pfVar23[lVar15 * 2 + 1]));
            auVar36 = ZEXT416((uint)(pfVar16[-1] - pfVar23[lVar15 * 2]));
            auVar47 = vfmadd213ss_fma(auVar33,auVar36,auVar37);
            auVar32 = vfmsub213ss_fma(ZEXT416((uint)fVar9),auVar34,ZEXT416((uint)fVar2));
            auVar36 = vfnmsub231ss_fma(ZEXT416((uint)(fVar8 * fVar5)),auVar36,auVar39);
            ioptr[lVar15 * 2] = fVar2;
            auVar33 = vfnmadd213ss_fma(auVar38,auVar34,auVar35);
            ioptr[lVar15 * 2 + 1] = auVar35._0_4_;
            auVar35 = vfnmadd231ss_fma(auVar47,ZEXT416((uint)fVar8),auVar39);
            pfVar16[uVar24 - 1] = auVar32._0_4_;
            fVar9 = auVar36._0_4_ + fVar6;
            pfVar16[uVar24] = auVar33._0_4_;
            fVar5 = *pfVar22;
            fVar2 = Utbl[lVar15 + 1];
            pfVar22 = pfVar22 + -1;
            auVar47 = vfmsub213ss_fma(ZEXT416((uint)fVar6),auVar34,ZEXT416((uint)fVar9));
            pfVar16[-1] = fVar9;
            auVar32 = vfnmadd213ss_fma(auVar37,auVar34,auVar35);
            *pfVar16 = auVar35._0_4_;
            pfVar16 = pfVar16 + -2;
            pfVar23[lVar15 * 2] = auVar47._0_4_;
            pfVar23[lVar15 * 2 + 1] = auVar32._0_4_;
            lVar15 = lVar15 + 1;
          } while (lVar27 != lVar15);
        }
        scbitrevR2(ioptr,uVar25,BRLow,auVar31._0_4_);
        auVar50 = vmovdqu64_avx512f(auVar49);
        auVar51 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar52 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        uVar28 = 2;
        if (lVar1 == 1) {
          uVar28 = 4;
          if (2 < uVar25) {
            uVar28 = 0;
            pfVar16 = ioptr;
            do {
              auVar53 = vpbroadcastq_avx512f();
              uVar28 = uVar28 + 0x10;
              auVar54 = vporq_avx512f(auVar53,auVar51);
              auVar53 = vporq_avx512f(auVar53,auVar52);
              uVar3 = vpcmpuq_avx512f(auVar53,auVar50,2);
              bVar17 = (byte)uVar3;
              uVar3 = vpcmpuq_avx512f(auVar54,auVar50,2);
              bVar14 = (byte)uVar3;
              uVar29 = CONCAT11(bVar14,bVar17);
              uVar30 = (ulong)uVar29;
              auVar53 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar16 + lVar27));
              auVar54._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar53._4_4_;
              auVar54._0_4_ = (uint)(bVar17 & 1) * auVar53._0_4_;
              auVar54._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar53._8_4_;
              auVar54._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar53._12_4_;
              auVar54._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar53._16_4_;
              auVar54._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar53._20_4_;
              auVar54._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar53._24_4_;
              auVar54._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar53._28_4_;
              auVar54._32_4_ = (uint)(bVar14 & 1) * auVar53._32_4_;
              auVar54._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar53._36_4_;
              auVar54._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar53._40_4_;
              auVar54._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar53._44_4_;
              auVar54._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar53._48_4_;
              auVar54._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar53._52_4_;
              auVar54._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar53._56_4_;
              auVar54._60_4_ = (uint)(bVar14 >> 7) * auVar53._60_4_;
              auVar53 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar16 + lVar27 + 0x10));
              auVar57._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar53._4_4_;
              auVar57._0_4_ = (uint)(bVar17 & 1) * auVar53._0_4_;
              auVar57._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar53._8_4_;
              auVar57._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar53._12_4_;
              auVar57._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar53._16_4_;
              auVar57._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar53._20_4_;
              auVar57._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar53._24_4_;
              auVar57._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar53._28_4_;
              auVar57._32_4_ = (uint)(bVar14 & 1) * auVar53._32_4_;
              auVar57._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar53._36_4_;
              auVar57._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar53._40_4_;
              auVar57._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar53._44_4_;
              auVar57._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar53._48_4_;
              auVar57._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar53._52_4_;
              auVar57._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar53._56_4_;
              auVar57._60_4_ = (uint)(bVar14 >> 7) * auVar53._60_4_;
              auVar53 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar16 + lVar27 + 4));
              auVar59._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar53._4_4_;
              auVar59._0_4_ = (uint)(bVar17 & 1) * auVar53._0_4_;
              auVar59._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar53._8_4_;
              auVar59._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar53._12_4_;
              auVar59._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar53._16_4_;
              auVar59._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar53._20_4_;
              auVar59._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar53._24_4_;
              auVar59._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar53._28_4_;
              auVar59._32_4_ = (uint)(bVar14 & 1) * auVar53._32_4_;
              auVar59._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar53._36_4_;
              auVar59._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar53._40_4_;
              auVar59._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar53._44_4_;
              auVar59._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar53._48_4_;
              auVar59._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar53._52_4_;
              auVar59._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar53._56_4_;
              auVar59._60_4_ = (uint)(bVar14 >> 7) * auVar53._60_4_;
              auVar53 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar16 + lVar27 + 0x14));
              auVar60._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar53._4_4_;
              auVar60._0_4_ = (uint)(bVar17 & 1) * auVar53._0_4_;
              auVar60._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar53._8_4_;
              auVar60._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar53._12_4_;
              auVar60._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar53._16_4_;
              auVar60._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar53._20_4_;
              auVar60._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar53._24_4_;
              auVar60._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar53._28_4_;
              auVar60._32_4_ = (uint)(bVar14 & 1) * auVar53._32_4_;
              auVar60._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar53._36_4_;
              auVar60._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar53._40_4_;
              auVar60._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar53._44_4_;
              auVar60._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar53._48_4_;
              auVar60._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar53._52_4_;
              auVar60._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar53._56_4_;
              auVar60._60_4_ = (uint)(bVar14 >> 7) * auVar53._60_4_;
              auVar53 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar16 + lVar27 + 0x20));
              auVar68._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar53._4_4_;
              auVar68._0_4_ = (uint)(bVar17 & 1) * auVar53._0_4_;
              auVar68._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar53._8_4_;
              auVar68._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar53._12_4_;
              auVar68._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar53._16_4_;
              auVar68._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar53._20_4_;
              auVar68._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar53._24_4_;
              auVar68._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar53._28_4_;
              auVar68._32_4_ = (uint)(bVar14 & 1) * auVar53._32_4_;
              auVar68._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar53._36_4_;
              auVar68._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar53._40_4_;
              auVar68._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar53._44_4_;
              auVar68._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar53._48_4_;
              auVar68._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar53._52_4_;
              auVar68._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar53._56_4_;
              auVar68._60_4_ = (uint)(bVar14 >> 7) * auVar53._60_4_;
              auVar53 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar16 + lVar27 + 0x30));
              auVar55._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar53._4_4_;
              auVar55._0_4_ = (uint)(bVar17 & 1) * auVar53._0_4_;
              auVar55._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar53._8_4_;
              auVar55._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar53._12_4_;
              auVar55._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar53._16_4_;
              auVar55._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar53._20_4_;
              auVar55._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar53._24_4_;
              auVar55._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar53._28_4_;
              auVar55._32_4_ = (uint)(bVar14 & 1) * auVar53._32_4_;
              auVar55._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar53._36_4_;
              auVar55._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar53._40_4_;
              auVar55._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar53._44_4_;
              auVar55._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar53._48_4_;
              auVar55._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar53._52_4_;
              auVar55._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar53._56_4_;
              auVar55._60_4_ = (uint)(bVar14 >> 7) * auVar53._60_4_;
              auVar53 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar16 + lVar27 + 0x24));
              auVar56._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar53._4_4_;
              auVar56._0_4_ = (uint)(bVar17 & 1) * auVar53._0_4_;
              auVar56._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar53._8_4_;
              auVar56._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar53._12_4_;
              auVar56._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar53._16_4_;
              auVar56._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar53._20_4_;
              auVar56._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar53._24_4_;
              auVar56._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar53._28_4_;
              auVar56._32_4_ = (uint)(bVar14 & 1) * auVar53._32_4_;
              auVar56._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar53._36_4_;
              auVar56._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar53._40_4_;
              auVar56._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar53._44_4_;
              auVar56._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar53._48_4_;
              auVar56._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar53._52_4_;
              auVar56._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar53._56_4_;
              auVar56._60_4_ = (uint)(bVar14 >> 7) * auVar53._60_4_;
              auVar53 = vaddps_avx512f(auVar57,auVar54);
              auVar54 = vsubps_avx512f(auVar54,auVar57);
              auVar57 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar16 + lVar27 + 0x34));
              auVar58._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar57._4_4_;
              auVar58._0_4_ = (uint)(bVar17 & 1) * auVar57._0_4_;
              auVar58._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar57._8_4_;
              auVar58._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar57._12_4_;
              auVar58._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar57._16_4_;
              auVar58._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar57._20_4_;
              auVar58._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar57._24_4_;
              auVar58._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar57._28_4_;
              auVar58._32_4_ = (uint)(bVar14 & 1) * auVar57._32_4_;
              auVar58._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar57._36_4_;
              auVar58._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar57._40_4_;
              auVar58._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar57._44_4_;
              auVar58._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar57._48_4_;
              auVar58._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar57._52_4_;
              auVar58._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar57._56_4_;
              auVar58._60_4_ = (uint)(bVar14 >> 7) * auVar57._60_4_;
              auVar57 = vaddps_avx512f(auVar60,auVar59);
              auVar59 = vsubps_avx512f(auVar59,auVar60);
              vscatterdps_avx512f(ZEXT864(pfVar16) + _DAT_00109440,uVar30,auVar53);
              auVar53 = vaddps_avx512f(auVar55,auVar68);
              auVar60 = vsubps_avx512f(auVar68,auVar55);
              vscatterdps_avx512f(ZEXT864(pfVar16) + _DAT_00109480,uVar30,auVar57);
              vscatterdps_avx512f(ZEXT864(pfVar16) + ZEXT864(0x10) + _DAT_00109440,uVar30,auVar54);
              auVar54 = vaddps_avx512f(auVar58,auVar56);
              auVar57 = vsubps_avx512f(auVar56,auVar58);
              vscatterdps_avx512f(ZEXT864(pfVar16) + ZEXT864(0x10) + _DAT_00109480,uVar30,auVar59);
              vscatterdps_avx512f(ZEXT864(pfVar16) + ZEXT864(0x20) + _DAT_00109440,uVar30,auVar53);
              vscatterdps_avx512f(ZEXT864(pfVar16) + ZEXT864(0x20) + _DAT_00109480,uVar30,auVar54);
              vscatterdps_avx512f(ZEXT864(pfVar16) + ZEXT864(0x30) + _DAT_00109440,uVar30,auVar60);
              vscatterdps_avx512f(ZEXT864(pfVar16) + ZEXT864(0x30) + _DAT_00109480,uVar30,auVar57);
              auVar53 = vgatherdps_avx512f(pfVar16[1]);
              auVar61._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar53._4_4_;
              auVar61._0_4_ = (uint)(bVar17 & 1) * auVar53._0_4_;
              auVar61._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar53._8_4_;
              auVar61._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar53._12_4_;
              auVar61._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar53._16_4_;
              auVar61._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar53._20_4_;
              auVar61._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar53._24_4_;
              auVar61._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar53._28_4_;
              auVar61._32_4_ = (uint)(bVar14 & 1) * auVar53._32_4_;
              auVar61._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar53._36_4_;
              auVar61._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar53._40_4_;
              auVar61._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar53._44_4_;
              auVar61._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar53._48_4_;
              auVar61._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar53._52_4_;
              auVar61._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar53._56_4_;
              auVar61._60_4_ = (uint)(bVar14 >> 7) * auVar53._60_4_;
              auVar53 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar16 * 2 + 0x10));
              auVar62._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar53._4_4_;
              auVar62._0_4_ = (uint)(bVar17 & 1) * auVar53._0_4_;
              auVar62._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar53._8_4_;
              auVar62._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar53._12_4_;
              auVar62._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar53._16_4_;
              auVar62._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar53._20_4_;
              auVar62._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar53._24_4_;
              auVar62._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar53._28_4_;
              auVar62._32_4_ = (uint)(bVar14 & 1) * auVar53._32_4_;
              auVar62._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar53._36_4_;
              auVar62._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar53._40_4_;
              auVar62._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar53._44_4_;
              auVar62._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar53._48_4_;
              auVar62._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar53._52_4_;
              auVar62._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar53._56_4_;
              auVar62._60_4_ = (uint)(bVar14 >> 7) * auVar53._60_4_;
              auVar53 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar16 * 2));
              auVar63._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar53._4_4_;
              auVar63._0_4_ = (uint)(bVar17 & 1) * auVar53._0_4_;
              auVar63._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar53._8_4_;
              auVar63._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar53._12_4_;
              auVar63._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar53._16_4_;
              auVar63._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar53._20_4_;
              auVar63._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar53._24_4_;
              auVar63._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar53._28_4_;
              auVar63._32_4_ = (uint)(bVar14 & 1) * auVar53._32_4_;
              auVar63._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar53._36_4_;
              auVar63._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar53._40_4_;
              auVar63._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar53._44_4_;
              auVar63._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar53._48_4_;
              auVar63._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar53._52_4_;
              auVar63._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar53._56_4_;
              auVar63._60_4_ = (uint)(bVar14 >> 7) * auVar53._60_4_;
              auVar54 = vgatherdps_avx512f(pfVar16[5]);
              auVar53._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar54._4_4_;
              auVar53._0_4_ = (uint)(bVar17 & 1) * auVar54._0_4_;
              auVar53._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar54._8_4_;
              auVar53._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar54._12_4_;
              auVar53._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar54._16_4_;
              auVar53._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar54._20_4_;
              auVar53._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar54._24_4_;
              auVar53._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar54._28_4_;
              auVar53._32_4_ = (uint)(bVar14 & 1) * auVar54._32_4_;
              auVar53._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar54._36_4_;
              auVar53._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar54._40_4_;
              auVar53._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar54._44_4_;
              auVar53._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar54._48_4_;
              auVar53._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar54._52_4_;
              auVar53._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar54._56_4_;
              auVar53._60_4_ = (uint)(bVar14 >> 7) * auVar54._60_4_;
              auVar54 = vgatherdps_avx512f(pfVar16[9]);
              auVar64._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar54._4_4_;
              auVar64._0_4_ = (uint)(bVar17 & 1) * auVar54._0_4_;
              auVar64._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar54._8_4_;
              auVar64._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar54._12_4_;
              auVar64._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar54._16_4_;
              auVar64._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar54._20_4_;
              auVar64._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar54._24_4_;
              auVar64._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar54._28_4_;
              auVar64._32_4_ = (uint)(bVar14 & 1) * auVar54._32_4_;
              auVar64._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar54._36_4_;
              auVar64._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar54._40_4_;
              auVar64._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar54._44_4_;
              auVar64._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar54._48_4_;
              auVar64._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar54._52_4_;
              auVar64._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar54._56_4_;
              auVar64._60_4_ = (uint)(bVar14 >> 7) * auVar54._60_4_;
              auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar16 * 2 + 0x30));
              auVar65._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar54._4_4_;
              auVar65._0_4_ = (uint)(bVar17 & 1) * auVar54._0_4_;
              auVar65._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar54._8_4_;
              auVar65._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar54._12_4_;
              auVar65._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar54._16_4_;
              auVar65._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar54._20_4_;
              auVar65._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar54._24_4_;
              auVar65._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar54._28_4_;
              auVar65._32_4_ = (uint)(bVar14 & 1) * auVar54._32_4_;
              auVar65._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar54._36_4_;
              auVar65._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar54._40_4_;
              auVar65._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar54._44_4_;
              auVar65._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar54._48_4_;
              auVar65._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar54._52_4_;
              auVar65._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar54._56_4_;
              auVar65._60_4_ = (uint)(bVar14 >> 7) * auVar54._60_4_;
              auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar16 * 2 + 0x20));
              auVar66._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar54._4_4_;
              auVar66._0_4_ = (uint)(bVar17 & 1) * auVar54._0_4_;
              auVar66._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar54._8_4_;
              auVar66._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar54._12_4_;
              auVar66._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar54._16_4_;
              auVar66._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar54._20_4_;
              auVar66._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar54._24_4_;
              auVar66._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar54._28_4_;
              auVar66._32_4_ = (uint)(bVar14 & 1) * auVar54._32_4_;
              auVar66._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar54._36_4_;
              auVar66._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar54._40_4_;
              auVar66._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar54._44_4_;
              auVar66._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar54._48_4_;
              auVar66._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar54._52_4_;
              auVar66._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar54._56_4_;
              auVar66._60_4_ = (uint)(bVar14 >> 7) * auVar54._60_4_;
              auVar54 = vsubps_avx512f(auVar61,auVar62);
              auVar57 = vaddps_avx512f(auVar62,auVar61);
              auVar59 = vgatherdps_avx512f(pfVar16[0xd]);
              auVar67._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar59._4_4_;
              auVar67._0_4_ = (uint)(bVar17 & 1) * auVar59._0_4_;
              auVar67._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar59._8_4_;
              auVar67._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar59._12_4_;
              auVar67._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar59._16_4_;
              auVar67._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar59._20_4_;
              auVar67._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar59._24_4_;
              auVar67._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar59._28_4_;
              auVar67._32_4_ = (uint)(bVar14 & 1) * auVar59._32_4_;
              auVar67._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar59._36_4_;
              auVar67._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar59._40_4_;
              auVar67._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar59._44_4_;
              auVar67._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar59._48_4_;
              auVar67._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar59._52_4_;
              auVar67._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar59._56_4_;
              auVar67._60_4_ = (uint)(bVar14 >> 7) * auVar59._60_4_;
              auVar59 = vaddps_avx512f(auVar53,auVar63);
              auVar53 = vsubps_avx512f(auVar63,auVar53);
              vscatterdps_avx512f(ZEXT864(pfVar16) + _DAT_001094c0,uVar30,auVar54);
              auVar54 = vsubps_avx512f(auVar64,auVar65);
              auVar60 = vaddps_avx512f(auVar65,auVar64);
              vscatterdps_avx512f(ZEXT864(pfVar16) + auVar57,uVar30,auVar59);
              vscatterdps_avx512f(ZEXT864(pfVar16) + ZEXT864(0x10) + _DAT_001094c0,uVar30,auVar57);
              auVar59 = vaddps_avx512f(auVar67,auVar66);
              auVar68 = vsubps_avx512f(auVar66,auVar67);
              vscatterdps_avx512f(ZEXT864(pfVar16) + ZEXT864(0x10) + auVar57,uVar30,auVar53);
              vscatterdps_avx512f(ZEXT864(pfVar16) + ZEXT864(0x20) + _DAT_001094c0,uVar30,auVar54);
              vscatterdps_avx512f(ZEXT864(pfVar16) + ZEXT864(0x20) + auVar57,uVar30,auVar59);
              vscatterdps_avx512f(ZEXT864(pfVar16) + ZEXT864(0x30) + _DAT_001094c0,uVar30,auVar60);
              vscatterdps_avx512f(ZEXT864(pfVar16) + ZEXT864(0x30) + auVar57,uVar30,auVar68);
              pfVar16 = pfVar16 + 0x100;
            } while (((uVar24 >> 3) + 0xf & 0xfffffffffffffff0) != uVar28);
            uVar28 = 4;
            goto LAB_00106b79;
          }
LAB_00106ba8:
          ibfstages(ioptr,uVar25,Utbl,2,uVar28,StageCnt);
        }
        else {
LAB_00106b79:
          if (lVar1 == 2) {
            ibfR4(ioptr,uVar25,uVar28);
            uVar28 = (ulong)(uint)((int)uVar28 << 2);
          }
          if (uVar25 < 0xc) goto LAB_00106ba8;
          ifftrecurs(ioptr,uVar25,Utbl,2,uVar28,StageCnt);
        }
        ioptr = ioptr + lVar21;
        pfVar26 = pfVar26 + lVar21;
        pfVar23 = pfVar23 + lVar21;
        bVar4 = 1 < Rows;
        Rows = Rows + -1;
      } while (bVar4);
    }
  }
  return;
}

Assistant:

void riffts1(float *ioptr, long M, long Rows, float *Utbl, short *BRLow){
/* Compute in-place real ifft on the rows of the input array	*/
/* data order as from rffts1 */
/* INPUTS */
/* *ioptr = input data array in the following order	*/
/* M = log2 of fft size	*/
/* Re(x[0]), Re(x[N/2]), Re(x[1]), Im(x[1]), Re(x[2]), Im(x[2]), ... Re(x[N/2-1]), Im(x[N/2-1]). */
/* Rows = number of rows in ioptr array (use Rows of 1 if ioptr is a 1 dimensional array)	*/
/* *Utbl = cosine table	*/
/* *BRLow = bit reversed counter table	*/
/* OUTPUTS */
/* *ioptr = real output data array	*/

float	scale;
long 	StageCnt;
long 	NDiffU;

scale = 1.0/POW2(M);
M=M-1;
switch (M){
case -1:
	break;
case 0:
	for (;Rows>0;Rows--){
		rifft1pt(ioptr, scale);				/* a 2 pt fft */
		ioptr += 2*POW2(M);
	}
case 1:
	for (;Rows>0;Rows--){
		rifft2pt(ioptr, scale);				/* a 4 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 2:
	for (;Rows>0;Rows--){
		rifft4pt(ioptr, scale);				/* an 8 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 3:
	for (;Rows>0;Rows--){
		rifft8pt(ioptr, scale);				/* a 16 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
default:
	for (;Rows>0;Rows--){

		ifrstage(ioptr, M+1, Utbl);

		scbitrevR2(ioptr, M, BRLow, scale);						/* bit reverse and first radix 2 stage */
		
		StageCnt = (M-1) / 3;		// number of radix 8 stages
		NDiffU = 2;				// one radix 2 stage already complete

		if ( (M-1-(StageCnt * 3)) == 1 ){
			ibfR2(ioptr, M, NDiffU);			/* 1 radix 2 stage */
			NDiffU *= 2;
		}

		if ( (M-1-(StageCnt * 3)) == 2 ){
			ibfR4(ioptr, M, NDiffU);			/* 1 radix 4 stage */
			NDiffU *= 4;
		}

		if (M <= MCACHE){
			ibfstages(ioptr, M, Utbl, 2, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
		}

		else{
			ifftrecurs(ioptr, M, Utbl, 2, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
		}

		ioptr += 2*POW2(M);
	}
}
}